

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::TemplatedDecodeSortKey<duckdb::SortKeyConstantOperator<duckdb::hugeint_t>>
               (DecodeSortKeyData *decode_data,DecodeSortKeyVectorData *vector_data,Vector *result,
               idx_t result_idx)

{
  char cVar1;
  idx_t iVar2;
  char *in_RSI;
  long *in_RDI;
  idx_t increment;
  idx_t in_stack_00000010;
  data_t validity_byte;
  idx_t in_stack_ffffffffffffffc8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffd0;
  
  cVar1 = *(char *)(*in_RDI + in_RDI[2]);
  in_RDI[2] = in_RDI[2] + 1;
  if (cVar1 == *in_RSI) {
    FlatVector::Validity((Vector *)0x13f5c7c);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    iVar2 = SortKeyConstantOperator<duckdb::hugeint_t>::Decode
                      (&result->vector_type,(Vector *)result_idx,in_stack_00000010,increment._7_1_);
    in_RDI[2] = iVar2 + in_RDI[2];
  }
  return;
}

Assistant:

void TemplatedDecodeSortKey(DecodeSortKeyData &decode_data, DecodeSortKeyVectorData &vector_data, Vector &result,
                            idx_t result_idx) {
	auto validity_byte = decode_data.data[decode_data.position];
	decode_data.position++;
	if (validity_byte == vector_data.null_byte) {
		// NULL value
		FlatVector::Validity(result).SetInvalid(result_idx);
		return;
	}
	idx_t increment = OP::Decode(decode_data.data + decode_data.position, result, result_idx, vector_data.flip_bytes);
	decode_data.position += increment;
}